

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::ListOpnd::IsEqualInternal(ListOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ListOpndType *this_00;
  ListOpndType *opnd_00;
  int i;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x94d,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((opnd->m_kind == OpndKindList) && (*(int *)&opnd[1]._vptr_Opnd == this->count)) {
    if (*(int *)&opnd[1]._vptr_Opnd < 1) {
      bVar2 = true;
    }
    else {
      i = 0;
      do {
        this_00 = Item(this,i);
        opnd_00 = Item((ListOpnd *)opnd,i);
        bVar2 = Opnd::IsEqual(&this_00->super_Opnd,&opnd_00->super_Opnd);
        if (!bVar2) {
          return bVar2;
        }
        i = i + 1;
      } while (i < this->count);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ListOpnd::IsEqualInternal(Opnd * opnd)
{
    Assert(m_kind == OpndKindList);
    if (!opnd->IsListOpnd())
    {
        return false;
    }
    ListOpnd* l2 = opnd->AsListOpnd();
    if (l2->Count() != Count())
    {
        return false;
    }
    for (int i = 0; i < Count(); ++i)
    {
        if (!Item(i)->IsEqual(l2->Item(i)))
        {
            return false;
        }
    }
    return true;
}